

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraLcr.c
# Opt level: O3

void Lcr_ManPrint(Fra_Lcr_t *p)

{
  int level;
  
  printf("Iterations = %d.  LitBeg = %d.  LitEnd = %d. (%6.2f %%).\n",
         ((double)p->nLitsEnd * 100.0) / (double)p->nLitsBeg,(ulong)(uint)p->nIters);
  level = 0xa110ca;
  printf("NBeg = %d. NEnd = %d. (Gain = %6.2f %%).  RBeg = %d. REnd = %d. (Gain = %6.2f %%).\n",
         ((double)(p->nNodesBeg - p->nNodesEnd) * 100.0) / (double)p->nNodesBeg,
         ((double)(p->nRegsBeg - p->nRegsEnd) * 100.0) / (double)p->nRegsBeg);
  Abc_Print(level,"%s =","AIG simulation  ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeSim / 1000000.0);
  Abc_Print(level,"%s =","AIG partitioning");
  Abc_Print(level,"%9.2f sec\n",(double)p->timePart / 1000000.0);
  Abc_Print(level,"%s =","AIG rebuiding   ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeTrav / 1000000.0);
  Abc_Print(level,"%s =","FRAIGing        ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeFraig / 1000000.0);
  Abc_Print(level,"%s =","AIG updating    ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeUpdate / 1000000.0);
  Abc_Print(level,"%s =","TOTAL RUNTIME   ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeTotal / 1000000.0);
  return;
}

Assistant:

void Lcr_ManPrint( Fra_Lcr_t * p )
{
    printf( "Iterations = %d.  LitBeg = %d.  LitEnd = %d. (%6.2f %%).\n", 
        p->nIters, p->nLitsBeg, p->nLitsEnd, 100.0*p->nLitsEnd/p->nLitsBeg );
    printf( "NBeg = %d. NEnd = %d. (Gain = %6.2f %%).  RBeg = %d. REnd = %d. (Gain = %6.2f %%).\n", 
        p->nNodesBeg, p->nNodesEnd, 100.0*(p->nNodesBeg-p->nNodesEnd)/p->nNodesBeg, 
        p->nRegsBeg, p->nRegsEnd, 100.0*(p->nRegsBeg-p->nRegsEnd)/p->nRegsBeg );
    ABC_PRT( "AIG simulation  ", p->timeSim  );
    ABC_PRT( "AIG partitioning", p->timePart );
    ABC_PRT( "AIG rebuiding   ", p->timeTrav );
    ABC_PRT( "FRAIGing        ", p->timeFraig );
    ABC_PRT( "AIG updating    ", p->timeUpdate );
    ABC_PRT( "TOTAL RUNTIME   ", p->timeTotal );
}